

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

void __thiscall Js::RecyclableObject::ClearWritableDataOnlyDetectionBit(RecyclableObject *this)

{
  bool bVar1;
  TypeId typeId;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  ArrayObject *this_02;
  DynamicObject *obj;
  RecyclableObject *this_local;
  
  typeId = GetTypeId(this);
  bVar1 = DynamicType::Is(typeId);
  if (bVar1) {
    this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
    this_01 = DynamicObject::GetTypeHandler(this_00);
    DynamicTypeHandler::ClearWritableDataOnlyDetectionBit(this_01);
    bVar1 = DynamicObject::HasObjectArray(this_00);
    if (bVar1) {
      this_02 = DynamicObject::GetObjectArrayOrFlagsAsArray(this_00);
      ClearWritableDataOnlyDetectionBit((RecyclableObject *)this_02);
    }
  }
  return;
}

Assistant:

void RecyclableObject::ClearWritableDataOnlyDetectionBit()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            obj->GetTypeHandler()->ClearWritableDataOnlyDetectionBit();
            if (obj->HasObjectArray())
            {
                obj->GetObjectArrayOrFlagsAsArray()->ClearWritableDataOnlyDetectionBit();
            }
        }
    }